

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O1

void __thiscall draco::PointAttribute::CopyFrom(PointAttribute *this,PointAttribute *src_att)

{
  unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *this_00;
  _Head_base<0UL,_draco::DataBuffer_*,_false> __ptr;
  int64_t iVar1;
  bool bVar2;
  _Head_base<0UL,_draco::DataBuffer_*,_false> this_01;
  AttributeTransformData *pAVar3;
  AttributeTransformData *pAVar4;
  default_delete<draco::AttributeTransformData> *this_02;
  pointer __p_1;
  pointer __p;
  AttributeTransformData *local_20;
  
  if ((this->attribute_buffer_)._M_t.
      super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
      super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
      super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl == (DataBuffer *)0x0) {
    this_01._M_head_impl = (DataBuffer *)operator_new(0x28);
    DataBuffer::DataBuffer(this_01._M_head_impl);
    this_00 = &this->attribute_buffer_;
    local_20 = (AttributeTransformData *)0x0;
    __ptr._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
         super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
         super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
    super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
    super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl = this_01._M_head_impl;
    if (__ptr._M_head_impl != (DataBuffer *)0x0) {
      std::default_delete<draco::DataBuffer>::operator()
                ((default_delete<draco::DataBuffer> *)this_00,__ptr._M_head_impl);
    }
    if (local_20 != (AttributeTransformData *)0x0) {
      std::default_delete<draco::DataBuffer>::operator()
                ((default_delete<draco::DataBuffer> *)&local_20,(DataBuffer *)local_20);
    }
    GeometryAttribute::ResetBuffer
              (&this->super_GeometryAttribute,
               (this->attribute_buffer_)._M_t.
               super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
               super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl,0,0);
  }
  bVar2 = GeometryAttribute::CopyFrom
                    (&this->super_GeometryAttribute,&src_att->super_GeometryAttribute);
  if (bVar2) {
    this->identity_mapping_ = src_att->identity_mapping_;
    this->num_unique_entries_ = src_att->num_unique_entries_;
    std::
    vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ::operator=(&(this->indices_map_).vector_,&(src_att->indices_map_).vector_);
    pAVar4 = (src_att->attribute_transform_data_)._M_t.
             super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
             .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl;
    if (pAVar4 == (AttributeTransformData *)0x0) {
      pAVar4 = (this->attribute_transform_data_)._M_t.
               super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
               .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl;
      (this->attribute_transform_data_)._M_t.
      super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
      .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl =
           (AttributeTransformData *)0x0;
      if (pAVar4 == (AttributeTransformData *)0x0) {
        return;
      }
      this_02 = (default_delete<draco::AttributeTransformData> *)&this->attribute_transform_data_;
    }
    else {
      pAVar3 = (AttributeTransformData *)operator_new(0x30);
      pAVar3->transform_type_ = pAVar4->transform_type_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&(pAVar3->buffer_).data_,&(pAVar4->buffer_).data_);
      iVar1 = *(int64_t *)((long)&(pAVar4->buffer_).descriptor_ + 8);
      (pAVar3->buffer_).descriptor_.buffer_id = (pAVar4->buffer_).descriptor_.buffer_id;
      *(int64_t *)((long)&(pAVar3->buffer_).descriptor_ + 8) = iVar1;
      local_20 = (AttributeTransformData *)0x0;
      pAVar4 = (this->attribute_transform_data_)._M_t.
               super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
               .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl;
      (this->attribute_transform_data_)._M_t.
      super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
      .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl = pAVar3;
      if (pAVar4 != (AttributeTransformData *)0x0) {
        std::default_delete<draco::AttributeTransformData>::operator()
                  ((default_delete<draco::AttributeTransformData> *)&this->attribute_transform_data_
                   ,pAVar4);
      }
      if (local_20 == (AttributeTransformData *)0x0) {
        return;
      }
      this_02 = (default_delete<draco::AttributeTransformData> *)&local_20;
      pAVar4 = local_20;
    }
    std::default_delete<draco::AttributeTransformData>::operator()(this_02,pAVar4);
  }
  return;
}

Assistant:

void PointAttribute::CopyFrom(const PointAttribute &src_att) {
  if (buffer() == nullptr) {
    // If the destination attribute doesn't have a valid buffer, create it.
    attribute_buffer_ = std::unique_ptr<DataBuffer>(new DataBuffer());
    ResetBuffer(attribute_buffer_.get(), 0, 0);
  }
  if (!GeometryAttribute::CopyFrom(src_att)) {
    return;
  }
  identity_mapping_ = src_att.identity_mapping_;
  num_unique_entries_ = src_att.num_unique_entries_;
  indices_map_ = src_att.indices_map_;
  if (src_att.attribute_transform_data_) {
    attribute_transform_data_ = std::unique_ptr<AttributeTransformData>(
        new AttributeTransformData(*src_att.attribute_transform_data_));
  } else {
    attribute_transform_data_ = nullptr;
  }
}